

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_archive.hpp
# Opt level: O2

void __thiscall
pstore::serialize::archive::database_reader::get<unsigned_long,void>
          (database_reader *this,unsigned_long *v)

{
  value_type vVar1;
  unique_pointer<const_unsigned_long> result;
  
  vVar1 = (this->addr_).a_;
  vVar1 = (vVar1 + 7 & 0xfffffffffffffff8) - vVar1;
  if (vVar1 < 8) {
    address::operator+=(&this->addr_,vVar1);
    database::getrou<unsigned_long,void>
              ((database *)&result,(typed_address<unsigned_long>)this->db_);
    address::operator+=(&this->addr_,8);
    *v = *result._M_t.super___uniq_ptr_impl<const_unsigned_long,_void_(*)(const_unsigned_long_*)>.
          _M_t.super__Tuple_impl<0UL,_const_unsigned_long_*,_void_(*)(const_unsigned_long_*)>.
          super__Head_base<0UL,_const_unsigned_long_*,_false>._M_head_impl;
    std::unique_ptr<const_unsigned_long,_void_(*)(const_unsigned_long_*)>::~unique_ptr(&result);
    return;
  }
  assert_failed("extra_for_alignment < sizeof (Ty)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/db_archive.hpp"
                ,0x94);
}

Assistant:

void database_reader::get (Ty & v) {

                auto const extra_for_alignment = calc_alignment (addr_.absolute (), alignof (Ty));
                PSTORE_ASSERT (extra_for_alignment < sizeof (Ty));
                addr_ += extra_for_alignment;
                // Load the data.
                auto result = db_.getrou (typed_address<Ty> (addr_));
                addr_ += sizeof (Ty);
                // Copy to the destination.
                new (&v) Ty (*result);
            }